

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cc
# Opt level: O1

int __thiscall
google::protobuf::compiler::java::ImmutableExtensionGenerator::GenerateNonNestedInitializationCode
          (ImmutableExtensionGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  int iVar2;
  Nonnull<char_*> pcVar3;
  undefined8 extraout_RAX;
  FieldDescriptor **ppFVar4;
  FieldDescriptor *in_RDX;
  pointer unaff_R12;
  string_view text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  ExtensionGenerator local_50;
  FieldDescriptor *local_48;
  
  pFVar1 = this->descriptor_;
  if ((pFVar1->field_0x1 & 8) != 0) {
    iVar2 = 0;
    if ((pFVar1->scope_).containing_oneof == (OneofDescriptor *)0x0) {
      UnderscoresToCamelCaseCheckReserved_abi_cxx11_(&local_70,(java *)pFVar1,in_RDX);
      pFVar1 = this->descriptor_;
      if ((pFVar1->field_0x1 & 8) == 0) {
        ppFVar4 = &pFVar1->containing_type_->fields_;
      }
      else if ((pFVar1->scope_).extension_scope == (Descriptor *)0x0) {
        ppFVar4 = &pFVar1->file_->extensions_;
      }
      else {
        ppFVar4 = &((pFVar1->scope_).extension_scope)->extensions_;
      }
      pcVar3 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                         ((int)((ulong)((long)pFVar1 - (long)*ppFVar4) >> 3) * -0x45d1745d,
                          (Nonnull<char_*>)&stack0xffffffffffffffc0);
      local_50._vptr_ExtensionGenerator = (_func_int **)(pcVar3 + -(long)&stack0xffffffffffffffc0);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      local_48 = (FieldDescriptor *)&stack0xffffffffffffffc0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,(FieldDescriptor *)&stack0xffffffffffffffc0,pcVar3);
      text._M_str = "$name$.internalInit(descriptor.getExtensions().get($index$));\n";
      text._M_len = 0x3e;
      io::Printer::Print<char[5],std::__cxx11::string,char[6],std::__cxx11::string>
                (printer,text,(char (*) [5])0x10f3c63,&local_70,(char (*) [6])0x1104a3a,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      iVar2 = 0x15;
    }
    return iVar2;
  }
  GenerateNonNestedInitializationCode((ImmutableExtensionGenerator *)&local_50);
  if (local_90._M_dataplus._M_p != unaff_R12) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int ImmutableExtensionGenerator::GenerateNonNestedInitializationCode(
    io::Printer* printer) {
  int bytecode_estimate = 0;
  if (descriptor_->extension_scope() == nullptr) {
    // Only applies to non-nested extensions.
    printer->Print(
        "$name$.internalInit(descriptor.getExtensions().get($index$));\n",
        "name", UnderscoresToCamelCaseCheckReserved(descriptor_), "index",
        absl::StrCat(descriptor_->index()));
    bytecode_estimate += 21;
  }
  return bytecode_estimate;
}